

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.h
# Opt level: O3

void __thiscall google::CapturedStream::Capture(CapturedStream *this)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  LogMessage LStack_28;
  
  if (this->uncaptured_fd_ == -1) {
    iVar1 = dup(this->fd_);
    this->uncaptured_fd_ = iVar1;
    if (iVar1 == -1) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&LStack_28,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/googletest.h"
                 ,0x125);
      poVar3 = LogMessage::stream(&LStack_28);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"Check failed: uncaptured_fd_ != -1 ",0x23);
    }
    else {
      iVar1 = open((this->filename_)._M_dataplus._M_p,0x241,0x180);
      if (iVar1 == -1) {
        LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&LStack_28,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/googletest.h"
                   ,299);
        poVar3 = LogMessage::stream(&LStack_28);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,"Check failed: cap_fd != -1 ",0x1b);
      }
      else {
        fflush((FILE *)0x0);
        iVar2 = dup2(iVar1,this->fd_);
        if (iVar2 == -1) {
          LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&LStack_28,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/googletest.h"
                     ,0x12f);
          poVar3 = LogMessage::stream(&LStack_28);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3,"Check failed: dup2(cap_fd, fd_) != -1 ",0x26);
        }
        else {
          iVar1 = close(iVar1);
          if (iVar1 != -1) {
            return;
          }
          LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&LStack_28,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/googletest.h"
                     ,0x130);
          poVar3 = LogMessage::stream(&LStack_28);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3,"Check failed: close(cap_fd) != -1 ",0x22);
        }
      }
    }
  }
  else {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/googletest.h"
               ,0x123);
    poVar3 = LogMessage::stream(&LStack_28);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"Check failed: uncaptured_fd_ == -1 ",0x23);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", Stream ",9);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->fd_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," already captured!",0x12);
  }
  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_28);
}

Assistant:

void Capture() {
    // Keep original stream for later
    CHECK(uncaptured_fd_ == -1) << ", Stream " << fd_ << " already captured!";
    uncaptured_fd_ = dup(fd_);
    CHECK(uncaptured_fd_ != -1);

    // Open file to save stream to
    int cap_fd = open(filename_.c_str(),
                      O_CREAT | O_TRUNC | O_WRONLY,
                      S_IRUSR | S_IWUSR);
    CHECK(cap_fd != -1);

    // Send stdout/stderr to this file
    fflush(NULL);
    CHECK(dup2(cap_fd, fd_) != -1);
    CHECK(close(cap_fd) != -1);
  }